

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

_Bool change_panel(wchar_t dir)

{
  int iVar1;
  term_conflict *t;
  _Bool _Var2;
  int iVar3;
  _Bool _Var4;
  wchar_t wVar5;
  long lVar6;
  
  lVar6 = 0;
  _Var4 = false;
  do {
    if (lVar6 == 8) {
      return _Var4;
    }
    t = (term_conflict *)angband_term[lVar6];
    if (t != (term_conflict *)0x0) {
      if (lVar6 == 0) {
        iVar1 = Term->sidebar_mode;
        iVar3 = (Term->hgt - (row_top_map[iVar1] + row_bottom_map[iVar1])) / (int)(uint)tile_height;
        wVar5 = ~col_map[iVar1] + Term->wid;
      }
      else {
        if ((window_flag[lVar6] & 0x80) == 0) goto LAB_001edcd0;
        wVar5 = t->wid;
        iVar3 = t->hgt / (int)(uint)tile_height;
      }
      _Var2 = modify_panel(t,(ddy[dir] * iVar3) / 2 + t->offset_y,
                           ((int)ddx[dir] * (wVar5 / (int)(uint)tile_width)) / 2 + t->offset_x);
      _Var4 = (_Bool)(_Var4 | _Var2);
    }
LAB_001edcd0:
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

bool change_panel(int dir)
{
	bool changed = false;
	int j;

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		int screen_hgt, screen_wid;
		int wx, wy;

		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if ((j > 0) && !(window_flag[j] & PW_OVERHEAD)) continue;

		screen_hgt = (j == 0) ? SCREEN_HGT : t->hgt / tile_height;
		screen_wid = (j == 0) ? SCREEN_WID : t->wid / tile_width;

		/* Shift by half a panel */
		wy = t->offset_y + ddy[dir] * screen_hgt / 2;
		wx = t->offset_x + ddx[dir] * screen_wid / 2;

		/* Use "modify_panel" */
		if (modify_panel(t, wy, wx)) changed = true;
	}

	return (changed);
}